

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall
pbrt::syntactic::Texture::Texture(Texture *this,string *name,string *texelType,string *mapType)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  p_Var1 = &(this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_vptr_Texture = (_func_int **)&PTR_toString_abi_cxx11__00179e98;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar2,pcVar2 + name->_M_string_length);
  (this->texelType)._M_dataplus._M_p = (pointer)&(this->texelType).field_2;
  pcVar2 = (texelType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->texelType,pcVar2,pcVar2 + texelType->_M_string_length);
  (this->mapType)._M_dataplus._M_p = (pointer)&(this->mapType).field_2;
  pcVar2 = (mapType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mapType,pcVar2,pcVar2 + mapType->_M_string_length);
  (this->attributes).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->attributes).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

Texture(const std::string &name,
              const std::string &texelType,
              const std::string &mapType) 
        : name(name), texelType(texelType), mapType(mapType)
        {}